

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

void __thiscall
wasm::
SmallVector<wasm::Walker<wasm::(anonymous_namespace)::CatchPopFixup,wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,void>>::Task,10ul>
::
emplace_back<void(*&)(wasm::(anonymous_namespace)::CatchPopFixup*,wasm::Expression**),wasm::Expression**&>
          (SmallVector<wasm::Walker<wasm::(anonymous_namespace)::CatchPopFixup,wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,void>>::Task,10ul>
           *this,_func_void_CatchPopFixup_ptr_Expression_ptr_ptr **Args,Expression ***Args_1)

{
  size_type __n;
  reference this_00;
  Expression ***Args_local_1;
  _func_void_CatchPopFixup_ptr_Expression_ptr_ptr **Args_local;
  SmallVector<wasm::Walker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>::Task,_10UL>
  *this_local;
  
  if (*(ulong *)this < 10) {
    __n = *(size_type *)this;
    *(size_type *)this = __n + 1;
    this_00 = std::
              array<wasm::Walker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>::Task,_10UL>
              ::operator[]((array<wasm::Walker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>::Task,_10UL>
                            *)(this + 8),__n);
    Walker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
    ::Task::Task(this_00,*Args,*Args_1);
  }
  else {
    std::
    vector<wasm::Walker<wasm::(anonymous_namespace)::CatchPopFixup,wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,void>>::Task,std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CatchPopFixup,wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,void>>::Task>>
    ::
    emplace_back<void(*&)(wasm::(anonymous_namespace)::CatchPopFixup*,wasm::Expression**),wasm::Expression**&>
              ((vector<wasm::Walker<wasm::(anonymous_namespace)::CatchPopFixup,wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,void>>::Task,std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CatchPopFixup,wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,void>>::Task>>
                *)(this + 0xa8),Args,Args_1);
  }
  return;
}

Assistant:

void emplace_back(ArgTypes&&... Args) {
    if (usedFixed < N) {
      new (&fixed[usedFixed++]) T(std::forward<ArgTypes>(Args)...);
    } else {
      flexible.emplace_back(std::forward<ArgTypes>(Args)...);
    }
  }